

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O3

void Assimp::Q3Shader::ConvertShaderToMaterial(aiMaterial *out,ShaderDataBlock *shader)

{
  aiMaterial *this;
  _List_node_base *p_Var1;
  uint uVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  uint index;
  uint type;
  size_t __n;
  uint uVar5;
  int use_alpha;
  int twosided;
  uint local_45c;
  uint local_458;
  int local_454;
  aiMaterial *local_450;
  ulong local_448;
  _List_node_base *local_440;
  aiString local_438;
  
  if (out == (aiMaterial *)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD3/MD3Loader.cpp"
                  ,0x113,
                  "void Assimp::Q3Shader::ConvertShaderToMaterial(aiMaterial *, const ShaderDataBlock &)"
                 );
  }
  if (shader->cull == CULL_NONE) {
    local_438.length = 1;
    aiMaterial::AddBinaryProperty(out,&local_438,4,"$mat.twosided",0,0,aiPTI_Integer);
  }
  p_Var4 = (shader->maps).
           super__List_base<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_440 = (_List_node_base *)&shader->maps;
  if (p_Var4 != local_440) {
    uVar5 = 0;
    local_45c = 0;
    uVar3 = 0;
    local_450 = out;
    do {
      p_Var1 = local_440;
      __n = (ulong)p_Var4[1]._M_prev & 0xffffffff;
      if (((ulong)p_Var4[1]._M_prev & 0xfffffc00) != 0) {
        __n = 0x3ff;
      }
      local_438.length = (ai_uint32)__n;
      local_448 = uVar3;
      memcpy(local_438.data,p_Var4[1]._M_next,__n);
      this = local_450;
      local_438.data[__n] = '\0';
      local_458 = (uint)local_448;
      uVar2 = uVar5;
      if (*(int *)&p_Var4[3]._M_next == 3) {
        if (*(int *)((long)&p_Var4[3]._M_next + 4) != 2) goto LAB_00435cb8;
        type = 10;
        uVar2 = uVar5 + 1;
        index = uVar5;
      }
      else {
        if ((*(int *)&p_Var4[3]._M_next == 1) && (*(int *)((long)&p_Var4[3]._M_next + 4) == 1)) {
          if (p_Var4 != p_Var1->_M_next) {
            type = 4;
            index = local_458;
            local_458 = local_458 + 1;
            goto LAB_00435d01;
          }
          local_454 = 1;
        }
        else {
LAB_00435cb8:
          local_454 = 0;
        }
        aiMaterial::AddBinaryProperty(local_450,&local_454,4,"$mat.blend",0,0,aiPTI_Integer);
        type = 1;
        index = local_45c;
        local_45c = local_45c + 1;
        local_458 = (uint)local_448;
      }
LAB_00435d01:
      uVar5 = uVar2;
      aiMaterial::AddProperty(this,&local_438,"$tex.file",type,index);
      local_454 = (uint)(*(int *)&p_Var4[3]._M_prev == 0) * 2 + 2;
      aiMaterial::AddBinaryProperty(this,&local_454,4,"$tex.flags",type,index,aiPTI_Integer);
      p_Var4 = p_Var4->_M_next;
      uVar3 = (ulong)local_458;
    } while (p_Var4 != local_440);
    if (local_458 != 0) {
      local_438.length = 0x3f800000;
      local_438.data[0] = '\0';
      local_438.data[1] = '\0';
      local_438.data[2] = -0x80;
      local_438.data[3] = '?';
      local_438.data[4] = '\0';
      local_438.data[5] = '\0';
      local_438.data[6] = -0x80;
      local_438.data[7] = '?';
      aiMaterial::AddBinaryProperty(local_450,&local_438,0xc,"$clr.emissive",0,0,aiPTI_Float);
    }
  }
  return;
}

Assistant:

void Q3Shader::ConvertShaderToMaterial(aiMaterial* out, const ShaderDataBlock& shader)
{
    ai_assert(NULL != out);

    /*  IMPORTANT: This is not a real conversion. Actually we're just guessing and
     *  hacking around to build an aiMaterial that looks nearly equal to the
     *  original Quake 3 shader. We're missing some important features like
     *  animatable material properties in our material system, but at least
     *  multiple textures should be handled correctly.
     */

    // Two-sided material?
    if (shader.cull == Q3Shader::CULL_NONE) {
        const int twosided = 1;
        out->AddProperty(&twosided,1,AI_MATKEY_TWOSIDED);
    }

    unsigned int cur_emissive = 0, cur_diffuse = 0, cur_lm =0;

    // Iterate through all textures
    for (std::list< Q3Shader::ShaderMapBlock >::const_iterator it = shader.maps.begin(); it != shader.maps.end();++it) {

        // CONVERSION BEHAVIOUR:
        //
        //
        // If the texture is additive
        //  - if it is the first texture, assume additive blending for the whole material
        //  - otherwise register it as emissive texture.
        //
        // If the texture is using standard blend (or if the blend mode is unknown)
        //  - if first texture: assume default blending for material
        //  - in any case: set it as diffuse texture
        //
        // If the texture is using 'filter' blending
        //  - take as lightmap
        //
        // Textures with alpha funcs
        //  - aiTextureFlags_UseAlpha is set (otherwise aiTextureFlags_NoAlpha is explicitly set)
        aiString s((*it).name);
        aiTextureType type; unsigned int index;

        if ((*it).blend_src == Q3Shader::BLEND_GL_ONE && (*it).blend_dest == Q3Shader::BLEND_GL_ONE) {
            if (it == shader.maps.begin()) {
                const int additive = aiBlendMode_Additive;
                out->AddProperty(&additive,1,AI_MATKEY_BLEND_FUNC);

                index = cur_diffuse++;
                type  = aiTextureType_DIFFUSE;
            }
            else {
                index = cur_emissive++;
                type  = aiTextureType_EMISSIVE;
            }
        }
        else if ((*it).blend_src == Q3Shader::BLEND_GL_DST_COLOR && (*it).blend_dest == Q3Shader::BLEND_GL_ZERO) {
            index = cur_lm++;
            type  = aiTextureType_LIGHTMAP;
        }
        else {
            const int blend = aiBlendMode_Default;
            out->AddProperty(&blend,1,AI_MATKEY_BLEND_FUNC);

            index = cur_diffuse++;
            type  = aiTextureType_DIFFUSE;
        }

        // setup texture
        out->AddProperty(&s,AI_MATKEY_TEXTURE(type,index));

        // setup texture flags
        const int use_alpha = ((*it).alpha_test != Q3Shader::AT_NONE ? aiTextureFlags_UseAlpha : aiTextureFlags_IgnoreAlpha);
        out->AddProperty(&use_alpha,1,AI_MATKEY_TEXFLAGS(type,index));
    }
    // If at least one emissive texture was set, set the emissive base color to 1 to ensure
    // the texture is actually displayed.
    if (0 != cur_emissive) {
        aiColor3D one(1.f,1.f,1.f);
        out->AddProperty(&one,1,AI_MATKEY_COLOR_EMISSIVE);
    }
}